

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O3

int xml_parse_file_flags(xar *xar,char *name)

{
  int iVar1;
  xmlstatus xVar2;
  xar_file *pxVar3;
  char *p;
  
  iVar1 = strcmp(name,"UserNoDump");
  if (iVar1 == 0) {
    p = "nodump";
    xVar2 = FILE_FLAGS_USER_NODUMP;
  }
  else {
    iVar1 = strcmp(name,"UserImmutable");
    if (iVar1 == 0) {
      p = "uimmutable";
      xVar2 = FILE_FLAGS_USER_IMMUTABLE;
    }
    else {
      iVar1 = strcmp(name,"UserAppend");
      if (iVar1 == 0) {
        p = "uappend";
        xVar2 = FILE_FLAGS_USER_APPEND;
      }
      else {
        iVar1 = strcmp(name,"UserOpaque");
        if (iVar1 == 0) {
          p = "opaque";
          xVar2 = FILE_FLAGS_USER_OPAQUE;
        }
        else {
          iVar1 = strcmp(name,"UserNoUnlink");
          if (iVar1 == 0) {
            p = "nouunlink";
            xVar2 = FILE_FLAGS_USER_NOUNLINK;
          }
          else {
            iVar1 = strcmp(name,"SystemArchived");
            if (iVar1 == 0) {
              p = "archived";
              xVar2 = FILE_FLAGS_SYS_ARCHIVED;
            }
            else {
              iVar1 = strcmp(name,"SystemImmutable");
              if (iVar1 == 0) {
                p = "simmutable";
                xVar2 = FILE_FLAGS_SYS_IMMUTABLE;
              }
              else {
                iVar1 = strcmp(name,"SystemAppend");
                if (iVar1 == 0) {
                  p = "sappend";
                  xVar2 = FILE_FLAGS_SYS_APPEND;
                }
                else {
                  iVar1 = strcmp(name,"SystemNoUnlink");
                  if (iVar1 == 0) {
                    p = "nosunlink";
                    xVar2 = FILE_FLAGS_SYS_NOUNLINK;
                  }
                  else {
                    iVar1 = strcmp(name,"SystemSnapshot");
                    if (iVar1 != 0) {
                      return 0;
                    }
                    p = "snapshot";
                    xVar2 = FILE_FLAGS_SYS_SNAPSHOT;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  xar->xmlsts = xVar2;
  pxVar3 = xar->file;
  pxVar3->has = pxVar3->has | 0x1000;
  if ((pxVar3->fflags_text).length != 0) {
    archive_strappend_char(&pxVar3->fflags_text,',');
    pxVar3 = xar->file;
  }
  archive_strcat(&pxVar3->fflags_text,p);
  return 1;
}

Assistant:

static int
xml_parse_file_flags(struct xar *xar, const char *name)
{
	const char *flag = NULL;

	if (strcmp(name, "UserNoDump") == 0) {
		xar->xmlsts = FILE_FLAGS_USER_NODUMP;
		flag = "nodump";
	}
	else if (strcmp(name, "UserImmutable") == 0) {
		xar->xmlsts = FILE_FLAGS_USER_IMMUTABLE;
		flag = "uimmutable";
	}
	else if (strcmp(name, "UserAppend") == 0) {
		xar->xmlsts = FILE_FLAGS_USER_APPEND;
		flag = "uappend";
	}
	else if (strcmp(name, "UserOpaque") == 0) {
		xar->xmlsts = FILE_FLAGS_USER_OPAQUE;
		flag = "opaque";
	}
	else if (strcmp(name, "UserNoUnlink") == 0) {
		xar->xmlsts = FILE_FLAGS_USER_NOUNLINK;
		flag = "nouunlink";
	}
	else if (strcmp(name, "SystemArchived") == 0) {
		xar->xmlsts = FILE_FLAGS_SYS_ARCHIVED;
		flag = "archived";
	}
	else if (strcmp(name, "SystemImmutable") == 0) {
		xar->xmlsts = FILE_FLAGS_SYS_IMMUTABLE;
		flag = "simmutable";
	}
	else if (strcmp(name, "SystemAppend") == 0) {
		xar->xmlsts = FILE_FLAGS_SYS_APPEND;
		flag = "sappend";
	}
	else if (strcmp(name, "SystemNoUnlink") == 0) {
		xar->xmlsts = FILE_FLAGS_SYS_NOUNLINK;
		flag = "nosunlink";
	}
	else if (strcmp(name, "SystemSnapshot") == 0) {
		xar->xmlsts = FILE_FLAGS_SYS_SNAPSHOT;
		flag = "snapshot";
	}

	if (flag == NULL)
		return (0);
	xar->file->has |= HAS_FFLAGS;
	if (archive_strlen(&(xar->file->fflags_text)) > 0)
		archive_strappend_char(&(xar->file->fflags_text), ',');
	archive_strcat(&(xar->file->fflags_text), flag);
	return (1);
}